

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::SetUpPrinterInsert(QL_Manager *this,DataAttrInfo *attributes)

{
  DataAttrInfo *pDVar1;
  AttrCatEntry *pAVar2;
  int local_20;
  int i;
  RC rc;
  DataAttrInfo *attributes_local;
  QL_Manager *this_local;
  
  for (local_20 = 0; local_20 < this->relEntries->attrCount; local_20 = local_20 + 1) {
    pDVar1 = attributes + local_20;
    pAVar2 = this->attrEntries + local_20;
    *(undefined8 *)pDVar1->relName = *(undefined8 *)pAVar2->relName;
    *(undefined8 *)(pDVar1->relName + 8) = *(undefined8 *)(pAVar2->relName + 8);
    *(undefined8 *)(pDVar1->relName + 0x10) = *(undefined8 *)(pAVar2->relName + 0x10);
    pDVar1->relName[0x18] = pAVar2->relName[0x18];
    pAVar2 = this->attrEntries;
    *(undefined8 *)attributes[local_20].attrName = *(undefined8 *)pAVar2[local_20].attrName;
    *(undefined8 *)(attributes[local_20].attrName + 8) =
         *(undefined8 *)(pAVar2[local_20].attrName + 8);
    *(undefined8 *)(attributes[local_20].attrName + 0x10) =
         *(undefined8 *)(pAVar2[local_20].attrName + 0x10);
    attributes[local_20].attrName[0x18] = pAVar2[local_20].attrName[0x18];
    attributes[local_20].attrType = this->attrEntries[local_20].attrType;
    attributes[local_20].attrLength = this->attrEntries[local_20].attrLength;
    attributes[local_20].indexNo = this->attrEntries[local_20].indexNo;
    attributes[local_20].offset = this->attrEntries[local_20].offset;
  }
  return 0;
}

Assistant:

RC QL_Manager::SetUpPrinterInsert(DataAttrInfo *attributes){
  RC rc = 0;
  for(int i=0; i < relEntries->attrCount ; i++){
    memcpy(attributes[i].relName, attrEntries[i].relName, MAXNAME +1);
    memcpy(attributes[i].attrName, attrEntries[i].attrName, MAXNAME + 1);
    attributes[i].attrType = attrEntries[i].attrType;
    attributes[i].attrLength = attrEntries[i].attrLength;
    attributes[i].indexNo = attrEntries[i].indexNo;
    attributes[i].offset = attrEntries[i].offset;
  }
  return (0);
}